

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O1

void __thiscall Clone_variable_Test::TestBody(Clone_variable_Test *this)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_7;
  VariablePtr v;
  VariablePtr vClone;
  undefined1 local_88 [16];
  long local_78 [2];
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  string *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  string *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Variable::create();
  psVar1 = local_38;
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"lightning","");
  libcellml::Variable::setUnits(psVar1);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  libcellml::Variable::setInitialValue(-3.0);
  libcellml::Variable::setInterfaceType((InterfaceType)local_38);
  psVar1 = local_38;
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"id_unique","");
  libcellml::Entity::setId(psVar1);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"variable","");
  libcellml::NamedEntity::setName(local_38);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  libcellml::Variable::clone();
  local_68._0_8_ = (element_type *)0x0;
  libcellml::ParentedEntity::parent();
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::ParentedEntity>>
            ((AssertionResult *)local_88,(internal *)"nullptr","vClone->parent()",local_68,
             (void **)local_58,(shared_ptr<libcellml::ParentedEntity> *)in_R9);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_88[0] == (Message)0x0) {
    testing::Message::Message((Message *)local_58);
    if ((undefined8 *)local_88._8_8_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_88._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x80,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if (local_58 != (undefined1  [8])0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_58 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_58 + 8))();
      }
      local_58 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_88 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Variable::units();
  libcellml::Variable::units();
  testing::internal::
  CmpHelperNE<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            ((AssertionResult *)local_88,(internal *)"v->units()","vClone->units()",local_58,
             (shared_ptr<libcellml::Units> *)local_68,(shared_ptr<libcellml::Units> *)in_R9);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_88[0] == (Message)0x0) {
    testing::Message::Message((Message *)local_58);
    if ((undefined8 *)local_88._8_8_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_88._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x81,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if (local_58 != (undefined1  [8])0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_58 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_58 + 8))();
      }
      local_58 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_88 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Variable::initialValue_abi_cxx11_();
  libcellml::Variable::initialValue_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_68,(internal *)"v->initialValue()","vClone->initialValue()",
             local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             in_R9);
  if (local_58 != (undefined1  [8])&local_48) {
    operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
  }
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  if (local_68[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_68._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x82,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_58,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_58);
    if ((long *)local_88._0_8_ != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_88._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_88._0_8_ + 8))();
      }
      local_88._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_68 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Variable::interfaceType_abi_cxx11_();
  libcellml::Variable::interfaceType_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_68,(internal *)"v->interfaceType()","vClone->interfaceType()",
             local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             in_R9);
  if (local_58 != (undefined1  [8])&local_48) {
    operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
  }
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  if (local_68[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_68._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x83,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_58,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_58);
    if ((long *)local_88._0_8_ != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_88._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_88._0_8_ + 8))();
      }
      local_88._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_68 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Entity::id_abi_cxx11_();
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_68,(internal *)"v->id()","vClone->id()",local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,in_R9);
  if (local_58 != (undefined1  [8])&local_48) {
    operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
  }
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  if (local_68[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_68._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x84,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_58,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_58);
    if ((long *)local_88._0_8_ != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_88._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_88._0_8_ + 8))();
      }
      local_88._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_68 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::NamedEntity::name_abi_cxx11_();
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_68,(internal *)"v->name()","vClone->name()",local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,in_R9);
  if (local_58 != (undefined1  [8])&local_48) {
    operator_delete((void *)local_58,local_48._M_allocated_capacity + 1);
  }
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  if (local_68[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_68._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x85,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_58,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_58);
    if ((long *)local_88._0_8_ != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_88._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_88._0_8_ + 8))();
      }
      local_88._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_68 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_28;
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"on_my_own","");
  libcellml::Variable::setUnits(psVar1);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  psVar1 = local_28;
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"45.0","");
  libcellml::Variable::setInitialValue(psVar1);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  psVar1 = local_28;
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"public","");
  libcellml::Variable::setInterfaceType(psVar1);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  psVar1 = local_28;
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"unique_again","");
  libcellml::Entity::setId(psVar1);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"on_my_own","");
  libcellml::NamedEntity::setName(local_28);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  libcellml::Variable::units();
  libcellml::Variable::units();
  testing::internal::
  CmpHelperNE<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            ((AssertionResult *)local_88,(internal *)"v->units()","vClone->units()",local_58,
             (shared_ptr<libcellml::Units> *)local_68,(shared_ptr<libcellml::Units> *)in_R9);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_88[0] == (Message)0x0) {
    testing::Message::Message((Message *)local_58);
    if ((undefined8 *)local_88._8_8_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_88._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x8d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if (local_58 != (undefined1  [8])0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_58 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_58 + 8))();
      }
      local_58 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_88 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Variable::initialValue_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((AssertionResult *)local_58,(internal *)"v->initialValue()","\"-3\"",local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"-3",
             (char (*) [3])in_R9);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  if (local_58[0] == (Message)0x0) {
    testing::Message::Message((Message *)local_88);
    if (local_50 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x8e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if ((long *)local_88._0_8_ != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_88._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_88._0_8_ + 8))();
      }
      local_88._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Variable::interfaceType_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[8]>
            ((AssertionResult *)local_58,(internal *)"v->interfaceType()","\"private\"",local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"private",
             (char (*) [8])in_R9);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  if (local_58[0] == (Message)0x0) {
    testing::Message::Message((Message *)local_88);
    if (local_50 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x8f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if ((long *)local_88._0_8_ != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_88._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_88._0_8_ + 8))();
      }
      local_88._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
            ((AssertionResult *)local_58,(internal *)"v->id()","\"id_unique\"",local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"id_unique",
             (char (*) [10])in_R9);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  if (local_58[0] == (Message)0x0) {
    testing::Message::Message((Message *)local_88);
    if (local_50 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x90,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if ((long *)local_88._0_8_ != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_88._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_88._0_8_ + 8))();
      }
      local_88._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((AssertionResult *)local_58,(internal *)"v->name()","\"variable\"",local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"variable",
             (char (*) [9])in_R9);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  if (local_58[0] == (Message)0x0) {
    testing::Message::Message((Message *)local_88);
    if (local_50 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x91,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if ((long *)local_88._0_8_ != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && ((long *)local_88._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_88._0_8_ + 8))();
      }
      local_88._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  return;
}

Assistant:

TEST(Clone, variable)
{
    auto v = libcellml::Variable::create();
    v->setUnits("lightning");
    v->setInitialValue(-3.0);
    v->setInterfaceType(libcellml::Variable::InterfaceType::PRIVATE);
    v->setId("id_unique");
    v->setName("variable");

    auto vClone = v->clone();

    EXPECT_EQ(nullptr, vClone->parent());
    EXPECT_NE(v->units(), vClone->units());
    EXPECT_EQ(v->initialValue(), vClone->initialValue());
    EXPECT_EQ(v->interfaceType(), vClone->interfaceType());
    EXPECT_EQ(v->id(), vClone->id());
    EXPECT_EQ(v->name(), vClone->name());

    vClone->setUnits("on_my_own");
    vClone->setInitialValue("45.0");
    vClone->setInterfaceType("public");
    vClone->setId("unique_again");
    vClone->setName("on_my_own");

    EXPECT_NE(v->units(), vClone->units());
    EXPECT_EQ(v->initialValue(), "-3");
    EXPECT_EQ(v->interfaceType(), "private");
    EXPECT_EQ(v->id(), "id_unique");
    EXPECT_EQ(v->name(), "variable");
}